

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# valid.c
# Opt level: O3

int nodeVPush(xmlValidCtxtPtr ctxt,xmlNodePtr value)

{
  uint uVar1;
  int iVar2;
  xmlNodePtr *ppxVar3;
  uint uVar4;
  uint uVar5;
  
  iVar2 = ctxt->nodeNr;
  uVar1 = ctxt->nodeMax;
  if (iVar2 < (int)uVar1) {
    ppxVar3 = ctxt->nodeTab;
LAB_0015acae:
    ppxVar3[iVar2] = value;
    ctxt->node = value;
    ctxt->nodeNr = iVar2 + 1;
  }
  else {
    if ((int)uVar1 < 1) {
      uVar5 = 4;
LAB_0015ac89:
      ppxVar3 = (xmlNodePtr *)(*xmlRealloc)(ctxt->nodeTab,(ulong)uVar5 << 3);
      if (ppxVar3 != (xmlNodePtr *)0x0) {
        ctxt->nodeTab = ppxVar3;
        ctxt->nodeMax = uVar5;
        iVar2 = ctxt->nodeNr;
        goto LAB_0015acae;
      }
    }
    else if (uVar1 < 1000000000) {
      uVar4 = uVar1 + 1 >> 1;
      uVar5 = uVar4 + uVar1;
      if (1000000000 - uVar4 < uVar1) {
        uVar5 = 1000000000;
      }
      goto LAB_0015ac89;
    }
    xmlVErrMemory(ctxt);
    iVar2 = -1;
  }
  return iVar2;
}

Assistant:

static int
nodeVPush(xmlValidCtxtPtr ctxt, xmlNodePtr value)
{
    if (ctxt->nodeNr >= ctxt->nodeMax) {
        xmlNodePtr *tmp;
        int newSize;

        newSize = xmlGrowCapacity(ctxt->nodeMax, sizeof(tmp[0]),
                                  4, XML_MAX_ITEMS);
        if (newSize < 0) {
	    xmlVErrMemory(ctxt);
            return (-1);
        }
        tmp = xmlRealloc(ctxt->nodeTab, newSize * sizeof(tmp[0]));
        if (tmp == NULL) {
	    xmlVErrMemory(ctxt);
            return (-1);
        }
	ctxt->nodeTab = tmp;
        ctxt->nodeMax = newSize;
    }
    ctxt->nodeTab[ctxt->nodeNr] = value;
    ctxt->node = value;
    return (ctxt->nodeNr++);
}